

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O1

uint __thiscall
BTree<EntryBTree,EntryKey>::traverse<EntryUnpacker_const>
          (BTree<EntryBTree,EntryKey> *this,EntryUnpacker *traverseFunctor)

{
  bool bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined2 *puVar13;
  EntryKey key;
  ushort local_58;
  KeyType local_40;
  
  uVar5 = *(ushort *)(*(long *)this + 4);
  if (uVar5 == 0) {
    uVar12 = 0;
  }
  else {
    uVar2 = uVar5 << 8 | uVar5 >> 8;
    puVar13 = (undefined2 *)(*(long *)this + 6);
    uVar5 = 1;
    if (1 < uVar2) {
      uVar5 = uVar2;
    }
    uVar12 = 0;
    uVar10 = 0;
    do {
      uVar2 = swap_bytes(*puVar13);
      uVar6 = uVar2 >> 4 & 0x7ff;
      uVar8 = swap_bytes(*(undefined2 *)((long)puVar13 + (ulong)(uVar6 * 0xc + 0xc >> 3)));
      local_58 = uVar8 >> ((byte)uVar2 >> 2 & 4) & 0xfff;
      uVar11 = 0xc;
      iVar9 = 0;
      do {
        if (uVar6 * 4 + 4 == iVar9 + 4) {
          iVar7 = 5;
          break;
        }
        uVar2 = swap_bytes(*(undefined2 *)((long)puVar13 + (ulong)(uVar11 >> 3)));
        local_40.m_flags = 0;
        local_40.m_nameIndex = 0xffffffff;
        local_40.m_extIndex = 0xffffffff;
        local_40.m_linkIndex = 0xffffffff;
        puVar3 = EntryBTree::parseData
                           ((EntryBTree *)this,&local_40,
                            (uint8_t *)((ulong)(uVar2 >> ((byte)iVar9 & 4) & 0xfff) + (long)puVar13)
                           );
        if (puVar3 == (uint8_t *)0x0) {
          iVar7 = 0;
          bVar1 = true;
        }
        else {
          uVar12 = uVar12 + 1;
          bVar1 = EntryUnpacker::operator()(traverseFunctor,&local_40);
          iVar7 = (uint)!bVar1 << 3;
        }
        uVar11 = uVar11 + 0xc;
        iVar9 = iVar9 + 4;
      } while (bVar1 != false);
      if ((iVar7 != 5) && (iVar7 != 0)) {
        return uVar12;
      }
      uVar4 = (ulong)local_58;
      if (iVar7 != 5) {
        uVar4 = 0;
      }
      puVar13 = (undefined2 *)((long)puVar13 + uVar4);
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar5);
  }
  return uVar12;
}

Assistant:

unsigned int traverse(TraverseFunctor& traverseFunctor) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto p = m_data;
		
		const auto offsetAndCount = readNextWithByteSwap<uint32_t>(p);
		const auto nodeCount = readNextWithByteSwap<uint16_t>(p);
		
		UNUSED(offsetAndCount);
		
		auto visitedKeyCount = 0u;
		for (auto i = 0u; i < nodeCount; ++i) {
			const auto high = getBitsAt(p, 0) & UINT32_C(0x7FF);
			const auto nextOffset = getBitsAt(p, high + 1);
			
			for (auto j = 0u; j < high; ++j) {
				const auto offset = getBitsAt(p, j + 1);
				const auto data = advancePointer(p, offset);
				
				Key key;
				if (self.parseData(key, data)) {
					++visitedKeyCount;
					if (!traverseFunctor(key))
						goto done;
				}
			}
			
			p = advancePointer(p, nextOffset);
		}
		
	done:
		return visitedKeyCount;
	}